

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

double __thiscall Mat::sqrt(Mat *this,double __x)

{
  int iVar1;
  int iVar2;
  pointer p_Var3;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  int *in_RSI;
  long lVar4;
  double extraout_XMM0_Qa;
  double __x_00;
  
  Mat(this,*in_RSI,in_RSI[1]);
  iVar1 = in_RSI[1];
  iVar2 = *in_RSI;
  __x_00 = extraout_XMM0_Qa;
  if (0 < iVar1 * iVar2) {
    lVar4 = 0;
    do {
      __x_00 = Constant::Util::sqrt(*(Util **)(*(long *)(in_RSI + 4) + lVar4),__x_00);
      p_Var3 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined8 *)((long)p_Var3 + lVar4 + 8) = extraout_RDX;
      *(undefined8 *)((long)p_Var3 + lVar4) = extraout_RAX;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)(iVar1 * iVar2) << 4 != lVar4);
  }
  return __x_00;
}

Assistant:

Mat Mat::sqrt() {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = Constant::Util::sqrt(val[i]);
    }
    return ret;
}